

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

int method_callback(char *method_name,uchar *payload,size_t size,uchar **response,
                   size_t *response_size,void *user_ctx)

{
  int iVar1;
  uchar *puVar2;
  
  iVar1 = strcmp(method_name,"back_compat_method_name");
  if (iVar1 == 0) {
    *response_size = 1;
    puVar2 = (uchar *)malloc(1);
    *response = puVar2;
    *puVar2 = '\0';
  }
  return 200;
}

Assistant:

static int method_callback(const char* method_name, const unsigned char* payload, size_t size, unsigned char** response, size_t* response_size, void* user_ctx)
{
    (void)payload;
    (void)size;

    BACK_COMPAT_MSG_CTX* back_compat_info = (BACK_COMPAT_MSG_CTX*)user_ctx;
    if (strcmp(method_name, "back_compat_method_name") == 0)
    {
        *response_size = 1;
        *response = (unsigned char*)malloc(*response_size);
        (void)memcpy(*response, "", *response_size);
    }
    return 200;
}